

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

void play_game(game_mode_type mode)

{
  _Bool _Var1;
  byte local_15;
  _Bool local_e;
  _Bool local_d;
  game_mode_type local_c;
  _Bool retry;
  _Bool new_game;
  game_mode_type mode_local;
  
  local_c = mode;
  while( true ) {
    play_again = false;
    if (local_c < GAME_SELECT) {
      _Var1 = start_game(local_c == GAME_NEW);
      if (!_Var1) {
        quit("Broken savefile");
      }
    }
    else if (local_c == GAME_SELECT) {
      local_d = false;
      local_e = false;
      while( true ) {
        select_savefile(local_e,&local_d);
        _Var1 = start_game((_Bool)(local_d & 1));
        if (_Var1) break;
        local_e = true;
      }
    }
    else {
      quit("Invalid game mode in play_game()");
    }
    while( true ) {
      local_15 = 0;
      if ((player->is_dead & 1U) == 0) {
        local_15 = player->upkeep->playing;
      }
      if ((local_15 & 1) == 0) break;
      pre_turn_refresh();
      (*cmd_get_hook)(CTX_GAME);
      run_game_loop();
    }
    close_game(true);
    if ((play_again & 1U) == 0) break;
    cleanup_angband();
    init_display();
    init_angband();
    if (reinit_hook != (_func_void *)0x0) {
      (*reinit_hook)();
    }
    textui_init();
    if (local_c == GAME_LOAD) {
      local_c = GAME_NEW;
    }
  }
  return;
}

Assistant:

void play_game(enum game_mode_type mode)
{
	while (1) {
		play_again = false;

		/* Load a savefile or birth a character, or both */
		switch (mode) {
		case GAME_LOAD:
		case GAME_NEW:
			if (!start_game(mode == GAME_NEW)) {
				quit("Broken savefile");
			}
			break;

		case GAME_SELECT:
			{
				bool new_game = false, retry = false;

				while (1) {
					select_savefile(retry, &new_game);
					if (start_game(new_game)) {
						break;
					}
					retry = true;
				}
			}
			break;

		default:
			quit("Invalid game mode in play_game()");
			break;
		}

		/* Get commands from the user, then process the game world
		 * until the command queue is empty and a new player command
		 * is needed */
		while (!player->is_dead && player->upkeep->playing) {
			pre_turn_refresh();
			cmd_get_hook(CTX_GAME);
			run_game_loop();
		}

		/* Close game on death or quitting */
		close_game(true);

		if (!play_again) break;

		cleanup_angband();
		init_display();
		init_angband();
		if (reinit_hook != NULL) {
			(*reinit_hook)();
		}
		textui_init();
		if (mode == GAME_LOAD) {
			mode = GAME_NEW;
		}
	}
}